

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::InitializeAutogenTarget(cmQtAutoGenerators *this,cmTarget *target)

{
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_00;
  cmSourceFile *this_01;
  undefined8 uVar1;
  bool bVar2;
  cmMakefile *this_02;
  char *pcVar3;
  string *psVar4;
  reference pvVar5;
  size_type sVar6;
  cmGlobalGenerator *pcVar7;
  reference ppcVar8;
  char *comment;
  cmState *pcVar9;
  byte local_923;
  allocator local_771;
  string local_770;
  allocator local_749;
  string local_748;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  char *local_6d8;
  char *autogenFolder;
  cmTarget *autogenTarget;
  string local_6a8;
  allocator local_681;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_620 [8];
  string rcc_output_file;
  string rcc_output_dir;
  string basename;
  string local_5b8;
  allocator local_591;
  string local_590;
  undefined1 local_570 [8];
  string ext;
  string absFile;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_520;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_518;
  const_iterator fileIt;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  undefined1 local_4d0 [7];
  bool isNinja;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcc_output;
  undefined1 local_498 [8];
  string autogenComment;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_450;
  const_iterator local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  const_iterator local_410;
  undefined1 local_408 [8];
  string tools;
  value_type local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  value_type local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  value_type local_340;
  allocator local_319;
  string local_318;
  undefined1 local_2f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toolNames;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  char *local_290;
  char *autogenDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_268;
  undefined1 local_248 [8];
  string workingDirectory;
  cmCustomCommandLines commandLines;
  value_type local_208;
  allocator local_1e1;
  value_type local_1e0;
  allocator local_1b9;
  value_type local_1b8;
  undefined1 local_198 [8];
  cmCustomCommandLine currentLine;
  string targetDir;
  string autogenTargetName;
  string local_138;
  allocator local_111;
  undefined1 local_110 [8];
  string mocCppFile;
  string automocTargetName;
  string local_c8;
  undefined4 local_a8;
  allocator local_a1;
  string local_a0;
  allocator local_7d [20];
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string qtMajorVersion;
  cmMakefile *makefile;
  cmTarget *target_local;
  cmQtAutoGenerators *this_local;
  
  this_02 = cmTarget::GetMakefile(target);
  qtMajorVersion.field_2._8_8_ = this_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"QT_VERSION_MAJOR",&local_69);
  pcVar3 = cmMakefile::GetSafeDefinition(this_02,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar3,local_7d);
  std::allocator<char>::~allocator((allocator<char> *)local_7d);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"");
  uVar1 = qtMajorVersion.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"Qt5Core_VERSION_MAJOR",&local_a1);
    pcVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_a0);
    std::__cxx11::string::operator=((string *)local_48,pcVar3);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"4");
  if ((bVar2) &&
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"5"), bVar2)) {
    this_local._7_1_ = false;
    local_a8 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"AUTOMOC",
               (allocator *)(automocTargetName.field_2._M_local_buf + 0xf));
    bVar2 = cmTarget::GetPropertyAsBool(target,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(automocTargetName.field_2._M_local_buf + 0xf));
    if (bVar2) {
      getAutogenTargetName_abi_cxx11_((string *)((long)&mocCppFile.field_2 + 8),target);
      pcVar3 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)qtMajorVersion.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_110,pcVar3,&local_111);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::operator+=((string *)local_110,"/");
      std::__cxx11::string::operator+=
                ((string *)local_110,(string *)(mocCppFile.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_110,".cpp");
      cmMakefile::GetOrCreateSource
                ((cmMakefile *)qtMajorVersion.field_2._8_8_,(string *)local_110,true);
      uVar1 = qtMajorVersion.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_138,"ADDITIONAL_MAKE_CLEAN_FILES",
                 (allocator *)(autogenTargetName.field_2._M_local_buf + 0xf));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AppendProperty((cmMakefile *)uVar1,&local_138,pcVar3,false);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator
                ((allocator<char> *)(autogenTargetName.field_2._M_local_buf + 0xf));
      cmTarget::AddSource(target,(string *)local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(mocCppFile.field_2._M_local_buf + 8));
    }
    getAutogenTargetName_abi_cxx11_((string *)((long)&targetDir.field_2 + 8),target);
    getAutogenTargetDir_abi_cxx11_
              ((string *)
               &currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,target);
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_198);
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,psVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"-E",&local_1b9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"cmake_autogen",&local_1e1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,
                (value_type *)
                &currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_208,"$<CONFIGURATION>",
               (allocator *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
              ((long)&workingDirectory.field_2 + 8);
    cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this_00);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (this_00,(value_type *)local_198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_268,"",
               (allocator *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)qtMajorVersion.field_2._8_8_);
    cmsys::SystemTools::CollapseFullPath((string *)local_248,&local_268,pcVar3);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&autogenDepends);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,"AUTOGEN_TARGET_DEPENDS",&local_2b1);
    pcVar3 = cmTarget::GetProperty(target,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    local_290 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d8,pcVar3,
                 (allocator *)
                 ((long)&toolNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmSystemTools::ExpandListArgument
                (&local_2d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&autogenDepends,false);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&toolNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"AUTOMOC",&local_319);
    bVar2 = cmTarget::GetPropertyAsBool(target,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"moc",&local_341);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"AUTOUIC",&local_369);
    bVar2 = cmTarget::GetPropertyAsBool(target,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"uic",&local_391);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"AUTORCC",&local_3b9);
    bVar2 = cmTarget::GetPropertyAsBool(target,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e0,"rcc",(allocator *)(tools.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)(tools.field_2._M_local_buf + 0xf));
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2f8,0);
    std::__cxx11::string::string((string *)local_408,(string *)pvVar5);
    local_418._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2f8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_410,&local_418);
    local_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2f8,local_410);
    while (sVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2f8), 1 < sVar6) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8,0);
      std::operator+(&local_440,", ",pvVar5);
      std::__cxx11::string::operator+=((string *)local_408,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      local_450._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_448,&local_450);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8,local_448);
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8);
    if (sVar6 == 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&autogenComment.field_2 + 8)," and ",pvVar5);
      std::__cxx11::string::operator+=
                ((string *)local_408,(string *)(autogenComment.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(autogenComment.field_2._M_local_buf + 8));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rcc_output.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"Automatic ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rcc_output.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage," for target ");
    std::__cxx11::string::~string
              ((string *)
               &rcc_output.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    psVar4 = cmTarget::GetName_abi_cxx11_(target);
    std::__cxx11::string::operator+=((string *)local_498,(string *)psVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4d0);
    pcVar7 = cmMakefile::GetGlobalGenerator((cmMakefile *)qtMajorVersion.field_2._8_8_);
    (*pcVar7->_vptr_cmGlobalGenerator[2])
              (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &srcFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,"Ninja");
    std::__cxx11::string::~string
              ((string *)
               &srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
      cmTarget::GetConfigCommonSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
      local_520._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_518,&local_520);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
        bVar2 = __gnu_cxx::operator!=
                          (&local_518,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar2) break;
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_518);
        this_01 = *ppcVar8;
        psVar4 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
        cmsys::SystemTools::GetRealPath((string *)((long)&ext.field_2 + 8),psVar4,(string *)0x0);
        psVar4 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
        std::__cxx11::string::string((string *)local_570,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_590,"AUTORCC",&local_591);
        bVar2 = cmTarget::GetPropertyAsBool(target,&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        if (bVar2) {
          basename.field_2._M_local_buf[0xe] = '\0';
          basename.field_2._M_local_buf[0xd] = '\0';
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_570,"qrc");
          local_923 = 0;
          if (bVar2) {
            std::allocator<char>::allocator();
            basename.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string
                      ((string *)&local_5b8,"SKIP_AUTORCC",
                       (allocator *)(basename.field_2._M_local_buf + 0xf));
            basename.field_2._M_local_buf[0xd] = '\x01';
            pcVar3 = cmSourceFile::GetPropertyForUser(this_01,&local_5b8);
            bVar2 = cmSystemTools::IsOn(pcVar3);
            local_923 = bVar2 ^ 0xff;
          }
          if ((basename.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_5b8);
          }
          if ((basename.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)(basename.field_2._M_local_buf + 0xf));
          }
          if ((local_923 & 1) != 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension
                      ((string *)((long)&rcc_output_dir.field_2 + 8),
                       (string *)((long)&ext.field_2 + 8));
            cmTarget::GetSupportDirectory_abi_cxx11_
                      ((string *)((long)&rcc_output_file.field_2 + 8),target);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::MakeDirectory(pcVar3);
            std::__cxx11::string::string
                      ((string *)local_620,(string *)(rcc_output_file.field_2._M_local_buf + 8));
            std::operator+(&local_660,"/qrc_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&rcc_output_dir.field_2 + 8));
            std::operator+(&local_640,&local_660,".cpp");
            std::__cxx11::string::operator+=((string *)local_620,(string *)&local_640);
            std::__cxx11::string::~string((string *)&local_640);
            std::__cxx11::string::~string((string *)&local_660);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4d0,(value_type *)local_620);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_680,"GENERATED",&local_681);
            pcVar3 = cmSourceFile::GetPropertyForUser(this_01,&local_680);
            bVar2 = cmSystemTools::IsOn(pcVar3);
            std::__cxx11::string::~string((string *)&local_680);
            std::allocator<char>::~allocator((allocator<char> *)&local_681);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_48,"5");
              if (bVar2) {
                ListQt5RccInputs(&local_6a8,this,this_01,target,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&autogenDepends);
                std::__cxx11::string::~string((string *)&local_6a8);
              }
              else {
                ListQt4RccInputs((string *)&autogenTarget,this,this_01,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&autogenDepends);
                std::__cxx11::string::~string((string *)&autogenTarget);
              }
            }
            std::__cxx11::string::~string((string *)local_620);
            std::__cxx11::string::~string((string *)(rcc_output_file.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(rcc_output_dir.field_2._M_local_buf + 8));
          }
        }
        std::__cxx11::string::~string((string *)local_570);
        std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_518);
      }
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
    }
    uVar1 = qtMajorVersion.field_2._8_8_;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    comment = (char *)std::__cxx11::string::c_str();
    autogenFolder =
         (char *)cmMakefile::AddUtilityCommand
                           ((cmMakefile *)uVar1,(string *)((long)&targetDir.field_2 + 8),true,pcVar3
                            ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_4d0,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&autogenDepends,
                            (cmCustomCommandLines *)((long)&workingDirectory.field_2 + 8),false,
                            comment,false);
    pcVar9 = cmMakefile::GetState((cmMakefile *)qtMajorVersion.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f8,"AUTOMOC_TARGETS_FOLDER",&local_6f9);
    pcVar3 = cmState::GetGlobalProperty(pcVar9,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    local_6d8 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar9 = cmMakefile::GetState((cmMakefile *)qtMajorVersion.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_720,"AUTOGEN_TARGETS_FOLDER",&local_721);
      local_6d8 = cmState::GetGlobalProperty(pcVar9,&local_720);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator((allocator<char> *)&local_721);
    }
    pcVar3 = autogenFolder;
    if ((local_6d8 == (char *)0x0) || (*local_6d8 == '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_770,"FOLDER",&local_771);
      copyTargetProperty((cmTarget *)pcVar3,target,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_748,"FOLDER",&local_749);
      cmTarget::SetProperty((cmTarget *)pcVar3,&local_748,local_6d8);
      std::__cxx11::string::~string((string *)&local_748);
      std::allocator<char>::~allocator((allocator<char> *)&local_749);
    }
    cmTarget::AddUtility(target,(string *)((long)&targetDir.field_2 + 8),(cmMakefile *)0x0);
    this_local._7_1_ = true;
    local_a8 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4d0);
    std::__cxx11::string::~string((string *)local_498);
    std::__cxx11::string::~string((string *)local_408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&autogenDepends);
    std::__cxx11::string::~string((string *)local_248);
    cmCustomCommandLines::~cmCustomCommandLines
              ((cmCustomCommandLines *)((long)&workingDirectory.field_2 + 8));
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_198);
    std::__cxx11::string::~string
              ((string *)
               &currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(targetDir.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenerators::InitializeAutogenTarget(cmTarget* target)
{
  cmMakefile* makefile = target->GetMakefile();
  // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion == "")
    {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
    }
  if (qtMajorVersion != "4" && qtMajorVersion != "5")
    {
    return false;
    }

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = getAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = getAutogenTargetName(target);

  std::string targetDir = getAutogenTargetDir(target);

  cmCustomCommandLine currentLine;
  currentLine.push_back(cmSystemTools::GetCMakeCommand());
  currentLine.push_back("-E");
  currentLine.push_back("cmake_autogen");
  currentLine.push_back(targetDir);
  currentLine.push_back("$<CONFIGURATION>");

  cmCustomCommandLines commandLines;
  commandLines.push_back(currentLine);

  std::string workingDirectory = cmSystemTools::CollapseFullPath(
                                    "", makefile->GetCurrentBinaryDirectory());

  std::vector<std::string> depends;
  if (const char *autogenDepends =
                                target->GetProperty("AUTOGEN_TARGET_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(autogenDepends, depends);
    }
  std::vector<std::string> toolNames;
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    toolNames.push_back("moc");
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    toolNames.push_back("uic");
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    toolNames.push_back("rcc");
    }

  std::string tools = toolNames[0];
  toolNames.erase(toolNames.begin());
  while (toolNames.size() > 1)
    {
    tools += ", " + toolNames[0];
    toolNames.erase(toolNames.begin());
    }
  if (toolNames.size() == 1)
    {
    tools += " and " + toolNames[0];
    }
  std::string autogenComment = "Automatic " + tools + " for target ";
  autogenComment += target->GetName();

#if defined(_WIN32) && !defined(__CYGWIN__)
  bool usePRE_BUILD = false;
  cmGlobalGenerator* gg = makefile->GetGlobalGenerator();
  if(gg->GetName().find("Visual Studio") != std::string::npos)
    {
    cmGlobalVisualStudioGenerator* vsgg =
      static_cast<cmGlobalVisualStudioGenerator*>(gg);
    // Under VS >= 7 use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = vsgg->GetVersion() >= cmGlobalVisualStudioGenerator::VS7;
    if(usePRE_BUILD)
      {
      for (std::vector<std::string>::iterator it = depends.begin();
            it != depends.end(); ++it)
        {
        if(!makefile->FindTargetToUse(it->c_str()))
          {
          usePRE_BUILD = false;
          break;
          }
        }
      }
    }
#endif

  std::vector<std::string> rcc_output;
  bool const isNinja =
    makefile->GetGlobalGenerator()->GetName() == "Ninja";
  if(isNinja
#if defined(_WIN32) && !defined(__CYGWIN__)
        || usePRE_BUILD
#endif
        )
    {
    std::vector<cmSourceFile*> srcFiles;
    target->GetConfigCommonSourceFiles(srcFiles);
    for(std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
        fileIt != srcFiles.end();
        ++fileIt)
      {
      cmSourceFile* sf = *fileIt;
      std::string absFile = cmsys::SystemTools::GetRealPath(
                                                sf->GetFullPath());

      std::string ext = sf->GetExtension();

      if (target->GetPropertyAsBool("AUTORCC"))
        {
        if (ext == "qrc"
            && !cmSystemTools::IsOn(sf->GetPropertyForUser("SKIP_AUTORCC")))
          {
          std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFile);

          std::string rcc_output_dir = target->GetSupportDirectory();
          cmSystemTools::MakeDirectory(rcc_output_dir.c_str());
          std::string rcc_output_file = rcc_output_dir;
          rcc_output_file += "/qrc_" + basename + ".cpp";
          rcc_output.push_back(rcc_output_file);

          if (!cmSystemTools::IsOn(sf->GetPropertyForUser("GENERATED")))
            {
            if (qtMajorVersion == "5")
              {
              this->ListQt5RccInputs(sf, target, depends);
              }
            else
              {
              this->ListQt4RccInputs(sf, depends);
              }
#if defined(_WIN32) && !defined(__CYGWIN__)
            // Cannot use PRE_BUILD because the resource files themselves
            // may not be sources within the target so VS may not know the
            // target needs to re-build at all.
            usePRE_BUILD = false;
#endif
            }
          }
        }
      }
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if(usePRE_BUILD)
    {
    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    std::vector<std::string> no_output;
    std::vector<std::string> no_byproducts;
    cmCustomCommand cc(makefile, no_output, no_byproducts, depends,
                       commandLines, autogenComment.c_str(),
                       workingDirectory.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    target->AddPreBuildCommand(cc);
    }
  else
#endif
    {
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
                                autogenTargetName, true,
                                workingDirectory.c_str(),
                                /*byproducts=*/rcc_output, depends,
                                commandLines, false, autogenComment.c_str());

    // Set target folder
    const char* autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!autogenFolder)
      {
      autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      }
    if (autogenFolder && *autogenFolder)
      {
      autogenTarget->SetProperty("FOLDER", autogenFolder);
      }
    else
      {
      // inherit FOLDER property from target (#13688)
      copyTargetProperty(autogenTarget, target, "FOLDER");
      }

    target->AddUtility(autogenTargetName);
    }

  return true;
}